

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void many_handshakes(void)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  ptls_t *ppVar7;
  ptls_cipher_suite_t *ppVar8;
  ptls_async_job_t *ppVar9;
  size_t sVar10;
  size_t i;
  size_t sVar11;
  anon_struct_24_3_a6ccebed *paVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ptls_buffer_t hsbuf;
  size_t inlen;
  timeval start;
  size_t resplen;
  timeval end;
  ptls_t *local_20d8;
  ulong local_20d0;
  ptls_buffer_t local_20c8;
  ptls_t *local_20a8;
  size_t local_20a0;
  timeval local_2098;
  ptls_buffer_t local_2088;
  ptls_buffer_t local_2068;
  size_t local_2040;
  fd_set local_2038 [64];
  
  local_20a8 = ptls_client_new(ctx);
  local_2068.base = "";
  local_2068.capacity = 0;
  local_2068.off = 0;
  local_2068._24_8_ = local_2068._24_8_ & 0xffffffffffff0000;
  iVar3 = ptls_handshake(local_20a8,&local_2068,(void *)0x0,(size_t *)0x0,
                         (ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar3 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x1a3);
  local_2088.base = "";
  local_2088.capacity = 0;
  local_2088.off = 0;
  local_2088._24_8_ = local_2088._24_8_ & 0xffffffffffff0000;
  qat.first_pending = 0;
  piVar5 = &qat.conns[0].wait_fd;
  sVar10 = 1;
  do {
    ((anon_struct_24_3_a6ccebed *)(piVar5 + -4))->next_pending = sVar10;
    *(ptls_t **)(piVar5 + -2) = (ptls_t *)0x0;
    *piVar5 = -1;
    piVar5 = piVar5 + 6;
    sVar10 = sVar10 + 1;
  } while (sVar10 != 0xb);
  qat.conns[9].next_pending = 0xffffffffffffffff;
  gettimeofday(&local_2098,(__timezone_ptr_t)0x0);
  lVar15 = 0;
  local_20d0 = 0;
  local_20d8 = (ptls_t *)0x0;
  do {
    while (sVar10 = qat.first_pending, qat.first_pending == 0xffffffffffffffff) {
      if (lVar15 == 0) {
        gettimeofday((timeval *)local_2038,(__timezone_ptr_t)0x0);
        note("run %zu handshakes in %f seconds",
             SUB84(((double)local_2038[0].fds_bits[1] / 1000000.0 +
                   (double)local_2038[0].fds_bits[0]) -
                   ((double)local_2098.tv_usec / 1000000.0 + (double)local_2098.tv_sec),0),10000);
        ppVar7 = local_20a8;
        local_2068.off = 0;
        local_2040 = local_2088.off;
        iVar3 = ptls_handshake(local_20a8,&local_2068,local_2088.base,&local_2040,
                               (ptls_handshake_properties_t *)0x0);
        _ok((uint)(iVar3 == 0),"%s %d",
            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",0x203);
        ptls_buffer__release_memory(&local_2068);
        local_2068.off = 0;
        local_2068.is_allocated = '\0';
        local_2068.align_bits = '\0';
        local_2068._26_6_ = 0;
        local_2068.base = (uint8_t *)0x0;
        local_2068.capacity = 0;
        ptls_buffer__release_memory(&local_2088);
        local_2088.off = 0;
        local_2088.is_allocated = '\0';
        local_2088.align_bits = '\0';
        local_2088._26_6_ = 0;
        local_2088.base = (uint8_t *)0x0;
        local_2088.capacity = 0;
        ptls_free(ppVar7);
        return;
      }
      local_2038[0].fds_bits[0xe] = 0;
      local_2038[0].fds_bits[0xf] = 0;
      local_2038[0].fds_bits[0xc] = 0;
      local_2038[0].fds_bits[0xd] = 0;
      local_2038[0].fds_bits[10] = 0;
      local_2038[0].fds_bits[0xb] = 0;
      local_2038[0].fds_bits[8] = 0;
      local_2038[0].fds_bits[9] = 0;
      local_2038[0].fds_bits[6] = 0;
      local_2038[0].fds_bits[7] = 0;
      local_2038[0].fds_bits[4] = 0;
      local_2038[0].fds_bits[5] = 0;
      local_2038[0].fds_bits[2] = 0;
      local_2038[0].fds_bits[3] = 0;
      local_2038[0].fds_bits[0] = 0;
      local_2038[0].fds_bits[1] = 0;
      iVar3 = 0;
      lVar6 = 0x10;
      do {
        iVar4 = *(int *)((long)&qat.conns[0].next_pending + lVar6);
        if (iVar4 != -1) {
          iVar13 = iVar4 + 0x3f;
          if (-1 < iVar4) {
            iVar13 = iVar4;
          }
          local_2038[0].fds_bits[iVar13 >> 6] =
               local_2038[0].fds_bits[iVar13 >> 6] | 1L << ((byte)iVar4 & 0x3f);
          if (iVar3 <= iVar4) {
            iVar3 = iVar4 + 1;
          }
        }
        lVar6 = lVar6 + 0x18;
      } while (lVar6 != 0x100);
      iVar3 = select(iVar3,local_2038,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if (0 < iVar3) {
        piVar5 = &qat.conns[0].wait_fd;
        sVar11 = 0;
        sVar10 = qat.first_pending;
        do {
          uVar1 = *piVar5;
          if (uVar1 != 0xffffffff) {
            uVar14 = uVar1 + 0x3f;
            if (-1 < (int)uVar1) {
              uVar14 = uVar1;
            }
            if (((ulong)local_2038[0].fds_bits[(int)uVar14 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0)
            {
              *piVar5 = 0xffffffff;
              ((anon_struct_24_3_a6ccebed *)(piVar5 + -4))->next_pending = sVar10;
              sVar10 = sVar11;
              qat.first_pending = sVar11;
            }
          }
          sVar11 = sVar11 + 1;
          piVar5 = piVar5 + 6;
        } while (sVar11 != 10);
      }
    }
    paVar12 = qat.conns + qat.first_pending;
    qat.first_pending = paVar12->next_pending;
    paVar12->next_pending = 0xffffffffffffffff;
    if (qat.conns[sVar10].tls == (ptls_t *)0x0) {
      ppVar7 = ptls_server_new(ctx_peer);
      qat.conns[sVar10].tls = ppVar7;
      if (local_20d8 == (ptls_t *)0x0) {
        local_20d8 = ppVar7;
      }
      local_20d0 = local_20d0 + 1;
      lVar15 = lVar15 + 1;
    }
    local_20c8.off = 0;
    local_20c8.capacity = 0x2000;
    local_20c8._24_8_ = local_20c8._24_8_ & 0xffffffffffff0000;
    local_20c8.base = (uint8_t *)local_2038;
    ppVar8 = ptls_get_cipher(qat.conns[sVar10].tls);
    local_20a0 = 0;
    if (ppVar8 == (ptls_cipher_suite_t *)0x0) {
      local_20a0 = local_2068.off;
    }
    iVar3 = ptls_handshake(qat.conns[sVar10].tls,&local_20c8,local_2068.base,&local_20a0,
                           (ptls_handshake_properties_t *)0x0);
    if ((local_20d8 == qat.conns[sVar10].tls) &&
       (iVar4 = ptls_buffer__do_pushv(&local_2088,local_20c8.base,local_20c8.off), iVar4 != 0)) {
      bVar2 = false;
    }
    else {
      ptls_buffer__release_memory(&local_20c8);
      local_20c8.off = 0;
      local_20c8.is_allocated = '\0';
      local_20c8.align_bits = '\0';
      local_20c8._26_6_ = 0;
      local_20c8.base = (uint8_t *)0x0;
      local_20c8.capacity = 0;
      if (iVar3 == 0x20b) {
        ppVar9 = ptls_get_async_job(qat.conns[sVar10].tls);
        if (ppVar9->get_fd == (_func_int_st_ptls_async_job_t_ptr *)0x0) {
          __assert_fail("job->get_fd != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c"
                        ,0x1d9,"void many_handshakes(void)");
        }
        iVar3 = (*ppVar9->get_fd)(ppVar9);
        qat.conns[sVar10].wait_fd = iVar3;
        bVar2 = true;
        if (iVar3 == -1) {
LAB_0013913d:
          __assert_fail("qat.conns[offending].wait_fd != -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c"
                        ,0x1db,"void many_handshakes(void)");
        }
      }
      else {
        if (iVar3 != 0) {
          many_handshakes_cold_1();
          goto LAB_0013913d;
        }
        ppVar7 = qat.conns[sVar10].tls;
        if (ppVar7 == local_20d8) {
          local_20d8 = (ptls_t *)0x1;
        }
        ptls_free(ppVar7);
        qat.conns[sVar10].tls = (ptls_t *)0x0;
        lVar15 = lVar15 + -1;
        bVar2 = true;
        if (local_20d0 < 10000) {
          paVar12->next_pending = qat.first_pending;
          qat.first_pending = sVar10;
        }
      }
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void many_handshakes(void)
{
    ptls_t *client = ptls_new(ctx, 0), *resp_sample_conn = NULL;
    ptls_buffer_t clientbuf, resp_sample;
    int ret;

    { /* generate ClientHello that we would be sent to all the server-side objects */
        ptls_buffer_init(&clientbuf, "", 0);
        ret = ptls_handshake(client, &clientbuf, NULL, NULL, NULL);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    }

    ptls_buffer_init(&resp_sample, "", 0);

    qat.first_pending = 0;
    for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
        qat.conns[i].next_pending = i + 1;
        qat.conns[i].tls = NULL;
        qat.conns[i].wait_fd = -1;
    }
    qat.conns[PTLS_ELEMENTSOF(qat.conns) - 1].next_pending = SIZE_MAX;

    struct timeval start, end;
    gettimeofday(&start, NULL);

    static const size_t num_total = 10000;
    size_t num_issued = 0, num_running = 0;
    while (1) {
        while (qat.first_pending != SIZE_MAX) {
            size_t offending = qat.first_pending;
            /* detach the offending entry from pending list */
            qat.first_pending = qat.conns[offending].next_pending;
            qat.conns[offending].next_pending = SIZE_MAX;
            /* run the offending entry */
            if (qat.conns[offending].tls == NULL) {
                qat.conns[offending].tls = ptls_new(ctx_peer, 1);
                if (resp_sample_conn == NULL)
                    resp_sample_conn = qat.conns[offending].tls;
                ++num_issued;
                ++num_running;
            }
            ptls_buffer_t hsbuf;
            uint8_t hsbuf_small[8192];
            ptls_buffer_init(&hsbuf, hsbuf_small, sizeof(hsbuf_small));
            size_t inlen = ptls_get_cipher(qat.conns[offending].tls) == NULL ? clientbuf.off : 0; /* feed CH only as first flight */
            int hsret = ptls_handshake(qat.conns[offending].tls, &hsbuf, clientbuf.base, &inlen, NULL);
            if (resp_sample_conn == qat.conns[offending].tls) {
                ptls_buffer_pushv(&resp_sample, hsbuf.base, hsbuf.off);
            }
            ptls_buffer_dispose(&hsbuf);
            /* advance the handshake context */
            switch (hsret) {
            case 0:
                if (qat.conns[offending].tls == resp_sample_conn)
                    resp_sample_conn = (void *)1;
                ptls_free(qat.conns[offending].tls);
                qat.conns[offending].tls = NULL;
                --num_running;
                if (num_issued < num_total)
                    qat_set_pending(offending);
                break;
            case PTLS_ERROR_ASYNC_OPERATION: {
                ptls_async_job_t *job = ptls_get_async_job(qat.conns[offending].tls);
                assert(job->get_fd != NULL);
                qat.conns[offending].wait_fd = job->get_fd(job);
                assert(qat.conns[offending].wait_fd != -1);
            } break;
            default:
                fprintf(stderr, "ptls_handshake returned %d\n", hsret);
                abort();
                break;
            }
        }
        if (num_running == 0)
            break;
        /* poll for next action */
        fd_set rfds;
        FD_ZERO(&rfds);
        int nfds = 0;
        for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
            if (qat.conns[i].wait_fd != -1) {
                FD_SET(qat.conns[i].wait_fd, &rfds);
                if (nfds <= qat.conns[i].wait_fd)
                    nfds = qat.conns[i].wait_fd + 1;
            }
        }
        if (select(nfds, &rfds, NULL, NULL, NULL) > 0) {
            for (size_t i = 0; i < PTLS_ELEMENTSOF(qat.conns); ++i) {
                if (qat.conns[i].wait_fd != -1 && FD_ISSET(qat.conns[i].wait_fd, &rfds)) {
                    qat.conns[i].wait_fd = -1;
                    qat_set_pending(i);
                }
            }
        }
    }

    gettimeofday(&end, NULL);

    note("run %zu handshakes in %f seconds", num_total,
         (end.tv_sec + end.tv_usec / 1000000.) - (start.tv_sec + start.tv_usec / 1000000.));

    clientbuf.off = 0;

    /* confirm that the response looks okay */
    size_t resplen = resp_sample.off;
    ok(ptls_handshake(client, &clientbuf, resp_sample.base, &resplen, NULL) == 0);

    ptls_buffer_dispose(&clientbuf);
    ptls_buffer_dispose(&resp_sample);
    ptls_free(client);

    return;
Exit:
    assert("unreachable");
}